

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

reference __thiscall
jsoncons::jsonpath::detail::
slice_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(slice_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *param_6)

{
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar1;
  json_array_receiver<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  accum;
  allocator<char> local_51;
  path_node_type *local_50;
  fd_set *local_48;
  timeval local_40;
  
  local_40.tv_sec = local_40.tv_sec & 0xffffffffffffff00;
  local_50 = last;
  local_48 = (fd_set *)current;
  pbVar1 = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>&>
           ::
           create_json<jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag,std::allocator<char>>
                     ((eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>&>
                       *)context,(json_array_arg_t *)&json_array_arg,(semantic_tag *)&local_40,
                      &local_51);
  local_40.tv_sec = (__time_t)&PTR__node_receiver_00b3a4c8;
  local_40.tv_usec = (__suseconds_t)pbVar1;
  select(this,(int)context,(fd_set *)root,(fd_set *)local_50,local_48,&local_40);
  return pbVar1;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code&) const override
        {
            auto jptr = context.create_json(json_array_arg, semantic_tag::none, context.get_allocator());
            json_array_receiver<Json,JsonReference> accum(jptr);
            select(context, root, last, current, accum, options);
            return *jptr;
        }